

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolarPosition.cc
# Opt level: O0

Eci * __thiscall
libsgp4::SolarPosition::FindPosition(Eci *__return_storage_ptr__,SolarPosition *this,DateTime *dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 local_a0 [8];
  Vector solar_position;
  double eps;
  double R;
  double nu;
  double Lsa;
  double O;
  double C;
  double e;
  double L;
  double M;
  double T;
  double year;
  double mjd;
  DateTime *dt_local;
  SolarPosition *this_local;
  
  dVar1 = DateTime::ToJ2000(dt);
  dVar2 = Delta_ET(this,dVar1 / 365.25 + 1900.0);
  dVar1 = (dVar1 + dVar2 / 86400.0) / 36525.0;
  dVar2 = Util::Wrap360(dVar1 * 35999.04975);
  dVar2 = Util::Wrap360(-((dVar1 * 3.3e-06 + 0.00015) * dVar1) * dVar1 + dVar2 + 358.47583);
  dVar2 = Util::DegreesToRadians(dVar2);
  dVar3 = Util::Wrap360(dVar1 * 36000.76892);
  dVar3 = Util::Wrap360(dVar1 * 0.0003025 * dVar1 + dVar3 + 279.69668);
  dVar3 = Util::DegreesToRadians(dVar3);
  dVar4 = -(dVar1 * 1.26e-07 + 4.18e-05) * dVar1 + 0.01675104;
  dVar5 = sin(dVar2);
  dVar6 = sin(dVar2 * 2.0);
  dVar7 = sin(dVar2 * 3.0);
  dVar5 = Util::DegreesToRadians
                    (dVar7 * 0.000293 +
                     (-(dVar1 * 1.4e-05 + 0.004789) * dVar1 + 1.91946) * dVar5 +
                     (dVar1 * -0.0001 + 0.020094) * dVar6);
  dVar6 = Util::Wrap360(dVar1 * -1934.142 + 259.18);
  dVar6 = Util::DegreesToRadians(dVar6);
  dVar7 = sin(dVar6);
  dVar7 = Util::DegreesToRadians(dVar7 * -0.00479 + 0.00569);
  dVar3 = Util::WrapTwoPI((dVar3 + dVar5) - dVar7);
  dVar2 = Util::WrapTwoPI(dVar2 + dVar5);
  dVar2 = cos(dVar2);
  dVar5 = cos(dVar6);
  solar_position.w =
       Util::DegreesToRadians
                 (dVar5 * 0.00256 +
                  -((dVar1 * -5.03e-07 + 1.64e-06) * dVar1 + 0.0130125) * dVar1 + 23.452294);
  dVar1 = (((-dVar4 * dVar4 + 1.0) * 1.0000002) / (dVar4 * dVar2 + 1.0)) * 149597870.691;
  dVar2 = cos(dVar3);
  dVar4 = sin(dVar3);
  dVar5 = cos(solar_position.w);
  dVar3 = sin(dVar3);
  dVar6 = sin(solar_position.w);
  Vector::Vector((Vector *)local_a0,dVar1 * dVar2,dVar1 * dVar4 * dVar5,dVar1 * dVar3 * dVar6,dVar1)
  ;
  Eci::Eci(__return_storage_ptr__,dt,(Vector *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Eci SolarPosition::FindPosition(const DateTime& dt)
{
    const double mjd = dt.ToJ2000();
    const double year = 1900 + mjd / 365.25;
    const double T = (mjd + Delta_ET(year) / kSECONDS_PER_DAY) / 36525.0;
    const double M = Util::DegreesToRadians(Util::Wrap360(358.47583
                + Util::Wrap360(35999.04975 * T)
                - (0.000150 + 0.0000033 * T) * T * T));
    const double L = Util::DegreesToRadians(Util::Wrap360(279.69668
                + Util::Wrap360(36000.76892 * T)
                + 0.0003025 * T*T));
    const double e = 0.01675104 - (0.0000418 + 0.000000126 * T) * T;
    const double C = Util::DegreesToRadians((1.919460
                - (0.004789 + 0.000014 * T) * T) * sin(M)
                + (0.020094 - 0.000100 * T) * sin(2 * M)
                + 0.000293 * sin(3 * M));
    const double O = Util::DegreesToRadians(
            Util::Wrap360(259.18 - 1934.142 * T));
    const double Lsa = Util::WrapTwoPI(L + C
            - Util::DegreesToRadians(0.00569 - 0.00479 * sin(O)));
    const double nu = Util::WrapTwoPI(M + C);
    double R = 1.0000002 * (1 - e * e) / (1 + e * cos(nu));
    const double eps = Util::DegreesToRadians(23.452294 - (0.0130125
                + (0.00000164 - 0.000000503 * T) * T) * T + 0.00256 * cos(O));
    R = R * kAU;

    Vector solar_position(R * cos(Lsa),
            R * sin(Lsa) * cos(eps),
            R * sin(Lsa) * sin(eps),
            R);

    return Eci(dt, solar_position);
}